

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match_positions
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first;
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->prefix_level_ == NONE) {
    item_first._M_current =
         (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
    get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *)this,
               __return_storage_ptr__,item_first,item_first,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else {
    get_match_positions_component_prefix_dirpath(this,__return_storage_ptr__);
    if (this->prefix_level_ == BASENAME_WORD) {
      get_match_positions_basename_word_prefix(this,__return_storage_ptr__);
    }
    else {
      Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
      get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                ((Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *)this,
                 __return_storage_ptr__,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (this->item_basename_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (this->qit_basename_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      uVar4 = (long)puVar2 - (long)puVar1 >> 3;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar1,puVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar1,puVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> match_positions() const final {
    std::vector<std::size_t> posns;
    if (prefix_level_ == PrefixLevel::NONE) {
      get_match_positions_sorted_no_prefix(posns);
      return posns;
    }
    get_match_positions_component_prefix_dirpath(posns);
    if (prefix_level_ == PrefixLevel::BASENAME_WORD) {
      get_match_positions_basename_word_prefix(posns);
    } else {
      get_match_positions_basename_non_word_prefix(posns);
    }
    std::sort(posns.begin(), posns.end());
    return posns;
  }